

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

cmd_ln_t * cmd_ln_init(cmd_ln_t *inout_cmdln,arg_t *defn,int32 strict,...)

{
  char in_AL;
  char *pcVar1;
  cmd_ln_t *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_178;
  undefined8 *local_160;
  long *local_148;
  long *local_130;
  long local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_64;
  char **ppcStack_60;
  int32 f_argc;
  char **f_argv;
  char *val;
  char *arg;
  va_list args;
  int32 strict_local;
  arg_t *defn_local;
  cmd_ln_t *inout_cmdln_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_118;
  args[0]._0_8_ = &stack0x00000008;
  arg._4_4_ = 0x30;
  arg._0_4_ = 0x18;
  local_64 = 0;
  while( true ) {
    if ((uint)arg < 0x29) {
      local_130 = (long *)((long)args[0].overflow_arg_area + (long)(int)(uint)arg);
      arg._0_4_ = (uint)arg + 8;
    }
    else {
      local_130 = (long *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    val = (char *)*local_130;
    local_118[3] = in_RCX;
    local_f8 = in_R8;
    local_f0 = in_R9;
    if (val == (char *)0x0) {
      ppcStack_60 = (char **)__ckd_calloc__((long)local_64,8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                            ,0x2d9);
      args[0].overflow_arg_area = local_118;
      args[0]._0_8_ = &stack0x00000008;
      arg._4_4_ = 0x30;
      arg._0_4_ = 0x18;
      local_64 = 0;
      while( true ) {
        if ((uint)arg < 0x29) {
          local_160 = (undefined8 *)((long)(int)(uint)arg + (long)args[0].overflow_arg_area);
          arg._0_4_ = (uint)arg + 8;
        }
        else {
          local_160 = (undefined8 *)args[0]._0_8_;
          args[0]._0_8_ = args[0]._0_8_ + 8;
        }
        val = (char *)*local_160;
        if (val == (char *)0x0) break;
        pcVar1 = __ckd_salloc__(val,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                ,0x2dd);
        ppcStack_60[local_64] = pcVar1;
        local_64 = local_64 + 1;
        if ((uint)arg < 0x29) {
          local_178 = (undefined8 *)((long)(int)(uint)arg + (long)args[0].overflow_arg_area);
          arg._0_4_ = (uint)arg + 8;
        }
        else {
          local_178 = (undefined8 *)args[0]._0_8_;
          args[0]._0_8_ = args[0]._0_8_ + 8;
        }
        f_argv = (char **)*local_178;
        pcVar1 = __ckd_salloc__((char *)f_argv,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                ,0x2e0);
        ppcStack_60[local_64] = pcVar1;
        local_64 = local_64 + 1;
      }
      pcVar2 = parse_options(inout_cmdln,defn,local_64,ppcStack_60,strict);
      return pcVar2;
    }
    if ((uint)arg < 0x29) {
      local_148 = (long *)((long)args[0].overflow_arg_area + (long)(int)(uint)arg);
      arg._0_4_ = (uint)arg + 8;
    }
    else {
      local_148 = (long *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    f_argv = (char **)*local_148;
    if (f_argv == (char **)0x0) break;
    local_64 = local_64 + 2;
  }
  local_64 = local_64 + 1;
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
          ,0x2d1,"Number of arguments must be even!\n");
  return (cmd_ln_t *)0x0;
}

Assistant:

cmd_ln_t *
cmd_ln_init(cmd_ln_t *inout_cmdln, const arg_t *defn, int32 strict, ...)
{
    va_list args;
    const char *arg, *val;
    char **f_argv;
    int32 f_argc;

    va_start(args, strict);
    f_argc = 0;
    while ((arg = va_arg(args, const char *))) {
        ++f_argc;
        val = va_arg(args, const char*);
        if (val == NULL) {
            E_ERROR("Number of arguments must be even!\n");
            return NULL;
        }
        ++f_argc;
    }
    va_end(args);

    /* Now allocate f_argv */
    f_argv = (char**)ckd_calloc(f_argc, sizeof(*f_argv));
    va_start(args, strict);
    f_argc = 0;
    while ((arg = va_arg(args, const char *))) {
        f_argv[f_argc] = ckd_salloc(arg);
        ++f_argc;
        val = va_arg(args, const char*);
        f_argv[f_argc] = ckd_salloc(val);
        ++f_argc;
    }
    va_end(args);

    return parse_options(inout_cmdln, defn, f_argc, f_argv, strict);
}